

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O0

void __thiscall
lf::io::GmshReader::GmshReader
          (GmshReader *this,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *factory,
          GmshFileVariant *msh_file)

{
  anon_class_8_1_8991fb9c local_28;
  GmshFileVariant *local_20;
  GmshFileVariant *msh_file_local;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *factory_local;
  GmshReader *this_local;
  
  local_20 = msh_file;
  msh_file_local = (GmshFileVariant *)factory;
  factory_local =
       (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)this;
  std::shared_ptr<lf::mesh::Mesh>::shared_ptr(&this->mesh_);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::unique_ptr
            (&this->mesh_factory_,factory);
  std::
  shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::shared_ptr(&this->physical_nrs_);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::multimap(&this->name_2_nr_);
  std::
  multimap<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::multimap(&this->nr_2_name_);
  local_28.this = this;
  std::
  visit<lf::io::GmshReader::GmshReader(std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>,std::variant<lf::io::GMshFileV2,lf::io::GMshFileV4>const&)::__0,std::variant<lf::io::GMshFileV2,lf::io::GMshFileV4>const&>
            (&local_28,local_20);
  return;
}

Assistant:

GmshReader::GmshReader(std::unique_ptr<mesh::MeshFactory> factory,
                       const GmshFileVariant& msh_file)
    : mesh_factory_(std::move(factory)) {
  std::visit([this](const auto& mf) { InitGmshFile(mf); }, msh_file);
}